

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
::fastAccessDx(FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
               *this,int i)

{
  value_type *in_RDI;
  value_type *this_00;
  Fad<double> *in_stack_ffffffffffffffa0;
  Fad<double> *in_stack_ffffffffffffffa8;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffffb8;
  Fad<double> *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>::
  fastAccessDx((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
                *)in_RDI,(int)((ulong)in_RDI >> 0x20));
  FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_> *)this_00,
             (int)((ulong)in_RDI >> 0x20));
  operator-<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad(in_RDI);
  Fad<double>::~Fad(in_RDI);
  return this_00;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) - right_.fastAccessDx(i);}